

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbuserror.h
# Opt level: O0

void __thiscall QDBusError::~QDBusError(QDBusError *this)

{
  QString::~QString((QString *)0x124130);
  QString::~QString((QString *)0x12413e);
  return;
}

Assistant:

class Q_DBUS_EXPORT QDBusError
{
    Q_GADGET
public:
    enum ErrorType {
        NoError = 0,
        Other = 1,
        Failed,
        NoMemory,
        ServiceUnknown,
        NoReply,
        BadAddress,
        NotSupported,
        LimitsExceeded,
        AccessDenied,
        NoServer,
        Timeout,
        NoNetwork,
        AddressInUse,
        Disconnected,
        InvalidArgs,
        UnknownMethod,
        TimedOut,
        InvalidSignature,
        UnknownInterface,
        UnknownObject,
        UnknownProperty,
        PropertyReadOnly,
        InternalError,
        InvalidService,
        InvalidObjectPath,
        InvalidInterface,
        InvalidMember,

#ifndef Q_QDOC
        // don't use this one!
        LastErrorType = InvalidMember
#endif
    };
    Q_ENUM(ErrorType)

    QDBusError();
#ifndef QT_BOOTSTRAPPED
    explicit QDBusError(const DBusError *error);
    Q_IMPLICIT QDBusError(const QDBusMessage& msg);
#endif
    QDBusError(ErrorType error, const QString &message);
    QDBusError(const QDBusError &other);
    QDBusError(QDBusError &&other) noexcept
        : code(other.code), msg(std::move(other.msg)), nm(std::move(other.nm))
    {}
    QDBusError &operator=(QDBusError &&other) noexcept { swap(other); return *this; }
    QDBusError &operator=(const QDBusError &other);
#ifndef QT_BOOTSTRAPPED
    QDBusError &operator=(const QDBusMessage &msg);
#endif

    void swap(QDBusError &other) noexcept
    {
        std::swap(code, other.code);
        msg.swap(other.msg);
        nm.swap(other.nm);
    }

    ErrorType type() const;
    QString name() const;
    QString message() const;
    bool isValid() const;

    static QString errorString(ErrorType error);

private:
    ErrorType code;
    QString msg;
    QString nm;
    // ### This class has an implicit (therefore inline) destructor
    // so the following field cannot be used:
    void *unused;
}